

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O1

void Ssw_MatchingExtendOne(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(p);
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    uVar9 = 0xffffffff;
    lVar10 = 0;
    do {
      piVar1 = (int *)pVVar2->pArray[lVar10];
      if (piVar1 != (int *)0x0) {
        uVar4 = (uint)*(undefined8 *)(piVar1 + 6) & 7;
        if (((uVar4 == 2) || (uVar4 - 5 < 2)) && (*(long *)(piVar1 + 10) == 0)) {
          if ((((uint)*(undefined8 *)(piVar1 + 6) & 7) == 2) && (p->nTruePis <= *piVar1)) {
            if (*piVar1 < p->nTruePis) {
              __assert_fail("Saig_ObjIsLo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                            ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar4 = (*piVar1 - p->nTruePis) + p->nTruePos;
            if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) {
LAB_006a5e02:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar7 = (void *)(*(ulong *)((long)p->vCos->pArray[uVar4] + 8) & 0xfffffffffffffffe);
            if ((*(long *)((long)pvVar7 + 0x28) != 0) &&
               ((*(int *)((long)pvVar7 + 0x20) != p->nTravIds &&
                ((*(uint *)((long)pvVar7 + 0x18) & 7) != 1)))) {
              *(int *)((long)pvVar7 + 0x20) = p->nTravIds;
              uVar4 = vNodes->nCap;
              if (vNodes->nSize == uVar4) {
                if ((int)uVar4 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar3;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar4 * 2;
                  if (iVar5 <= (int)uVar4) goto LAB_006a5ab5;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc((ulong)uVar4 << 4);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
                  }
                  vNodes->pArray = ppvVar3;
                }
                vNodes->nCap = iVar5;
              }
LAB_006a5ab5:
              iVar5 = vNodes->nSize;
              vNodes->nSize = iVar5 + 1;
              vNodes->pArray[iVar5] = pvVar7;
            }
          }
          if (0xfffffffd < (piVar1[6] & 7U) - 7) {
            pvVar7 = (void *)(*(ulong *)(piVar1 + 2) & 0xfffffffffffffffe);
            if ((*(long *)((long)pvVar7 + 0x28) != 0) &&
               (*(int *)((long)pvVar7 + 0x20) != p->nTravIds)) {
              *(int *)((long)pvVar7 + 0x20) = p->nTravIds;
              uVar4 = vNodes->nCap;
              if (vNodes->nSize == uVar4) {
                if ((int)uVar4 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar3;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar4 * 2;
                  if (iVar5 <= (int)uVar4) goto LAB_006a5b72;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc((ulong)uVar4 << 4);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
                  }
                  vNodes->pArray = ppvVar3;
                }
                vNodes->nCap = iVar5;
              }
LAB_006a5b72:
              iVar5 = vNodes->nSize;
              vNodes->nSize = iVar5 + 1;
              vNodes->pArray[iVar5] = pvVar7;
            }
            pvVar7 = (void *)(*(ulong *)(piVar1 + 4) & 0xfffffffffffffffe);
            if ((*(long *)((long)pvVar7 + 0x28) != 0) &&
               (*(int *)((long)pvVar7 + 0x20) != p->nTravIds)) {
              *(int *)((long)pvVar7 + 0x20) = p->nTravIds;
              uVar4 = vNodes->nCap;
              if (vNodes->nSize == uVar4) {
                if ((int)uVar4 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar3;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar4 * 2;
                  if (iVar5 <= (int)uVar4) goto LAB_006a5c1d;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc((ulong)uVar4 << 4);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
                  }
                  vNodes->pArray = ppvVar3;
                }
                vNodes->nCap = iVar5;
              }
LAB_006a5c1d:
              iVar5 = vNodes->nSize;
              vNodes->nSize = iVar5 + 1;
              vNodes->pArray[iVar5] = pvVar7;
            }
          }
          if (p->pFanData == (int *)0x0) {
            __assert_fail("p->pFanData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                          ,0xa7,"void Ssw_MatchingExtendOne(Aig_Man_t *, Vec_Ptr_t *)");
          }
          if ((piVar1[6] & 0xffffffc0U) != 0) {
            uVar4 = 0;
LAB_006a5c4c:
            if (uVar4 == 0) {
              if (p->nFansAlloc <= piVar1[9]) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar5 = piVar1[9] * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar9 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar5 = (uVar9 & 1) + ((int)uVar9 >> 1) * 5 + 3;
            }
            pVVar2 = p->vObjs;
            uVar9 = p->pFanData[iVar5];
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar8 = (int *)0x0;
            }
            else {
              uVar6 = (int)uVar9 >> 1;
              if (((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) goto LAB_006a5e02;
              piVar8 = (int *)pVVar2->pArray[uVar6];
            }
            if (((uint)*(undefined8 *)(piVar8 + 6) & 7) == 3) {
              if (*piVar8 < p->nTruePos) goto LAB_006a5dcf;
              if (*piVar8 < p->nTruePos) goto LAB_006a5d25;
              if (*piVar8 < p->nTruePos) {
                __assert_fail("Saig_ObjIsLi(p, pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                              ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
              }
              uVar6 = (*piVar8 - p->nTruePos) + p->nTruePis;
              if (((int)uVar6 < 0) || (p->vCis->nSize <= (int)uVar6)) goto LAB_006a5e02;
              piVar8 = (int *)p->vCis->pArray[uVar6];
            }
LAB_006a5d25:
            if ((*(long *)(piVar8 + 10) != 0) && (piVar8[8] != p->nTravIds)) {
              piVar8[8] = p->nTravIds;
              uVar6 = vNodes->nCap;
              if (vNodes->nSize == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar3;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar6 * 2;
                  if (iVar5 <= (int)uVar6) goto LAB_006a5dbd;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc((ulong)uVar6 << 4);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar6 << 4);
                  }
                  vNodes->pArray = ppvVar3;
                }
                vNodes->nCap = iVar5;
              }
LAB_006a5dbd:
              iVar5 = vNodes->nSize;
              vNodes->nSize = iVar5 + 1;
              vNodes->pArray[iVar5] = piVar8;
            }
LAB_006a5dcf:
            uVar4 = uVar4 + 1;
            if ((uint)piVar1[6] >> 6 <= uVar4) goto LAB_006a5ddf;
            goto LAB_006a5c4c;
          }
        }
      }
LAB_006a5ddf:
      lVar10 = lVar10 + 1;
      pVVar2 = p->vObjs;
    } while (lVar10 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Ssw_MatchingExtendOne( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pNext, * pObj;
    int i, k, iFan = -1;
    Vec_PtrClear( vNodes );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( pObj->pData != NULL )
            continue;
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pNext = Saig_ObjLoToLi(p, pObj);
            pNext = Aig_ObjFanin0(pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) && !Aig_ObjIsConst1(pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        Aig_ObjForEachFanout( p, pObj, pNext, iFan, k )
        {
            if ( Saig_ObjIsPo(p, pNext) )
                continue;
            if ( Saig_ObjIsLi(p, pNext) )
                pNext = Saig_ObjLiToLo(p, pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
    }
}